

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O3

void __thiscall S2CellUnion::Expand(S2CellUnion *this,S1Angle min_radius,int max_level_diff)

{
  pointer pSVar1;
  ulong uVar2;
  ulong uVar3;
  int expand_level;
  pointer pSVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  S2LogMessage local_38;
  
  pSVar4 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar4 == pSVar1) {
    iVar5 = 0x1e;
  }
  else {
    iVar5 = 0x1e;
    do {
      uVar2 = pSVar4->id_;
      if (uVar2 == 0) {
        S2LogMessage::S2LogMessage
                  (&local_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.h"
                   ,0x223,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_38.stream_,"Check failed: id_ != 0 ",0x17);
        abort();
      }
      uVar3 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      iVar6 = 0x1e - ((uint)(uVar3 >> 1) & 0x7fffffff);
      if (iVar5 <= iVar6) {
        iVar6 = iVar5;
      }
      iVar5 = iVar6;
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  iVar6 = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,min_radius.radians_);
  if ((iVar6 == 0) && (dVar7 = ldexp(S2::kMinWidth,0), dVar7 < min_radius.radians_)) {
    Expand(this,0);
  }
  expand_level = iVar5 + max_level_diff;
  if (iVar6 < iVar5 + max_level_diff) {
    expand_level = iVar6;
  }
  Expand(this,expand_level);
  return;
}

Assistant:

void S2CellUnion::Expand(S1Angle min_radius, int max_level_diff) {
  int min_level = S2CellId::kMaxLevel;
  for (S2CellId id : *this) {
    min_level = min(min_level, id.level());
  }
  // Find the maximum level such that all cells are at least "min_radius" wide.
  int radius_level = S2::kMinWidth.GetLevelForMinValue(min_radius.radians());
  if (radius_level == 0 && min_radius.radians() > S2::kMinWidth.GetValue(0)) {
    // The requested expansion is greater than the width of a face cell.
    // The easiest way to handle this is to expand twice.
    Expand(0);
  }
  Expand(min(min_level + max_level_diff, radius_level));
}